

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cc
# Opt level: O0

bool prometheus::(anonymous_namespace)::
     FamilyNameExists<std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>const&>
               (string *name,
               vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,_std::default_delete<prometheus::Family<prometheus::Histogram>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,_std::default_delete<prometheus::Family<prometheus::Histogram>_>_>_>_>
               *families,
               vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,_std::default_delete<prometheus::Family<prometheus::Summary>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,_std::default_delete<prometheus::Family<prometheus::Summary>_>_>_>_>
               *args)

{
  bool local_59;
  __normal_iterator<const_std::unique_ptr<prometheus::Family<prometheus::Histogram>,_std::default_delete<prometheus::Family<prometheus::Histogram>_>_>_*,_std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,_std::default_delete<prometheus::Family<prometheus::Histogram>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,_std::default_delete<prometheus::Family<prometheus::Histogram>_>_>_>_>_>
  local_58;
  string *local_50;
  unique_ptr<prometheus::Family<prometheus::Histogram>,_std::default_delete<prometheus::Family<prometheus::Histogram>_>_>
  *local_48;
  __normal_iterator<const_std::unique_ptr<prometheus::Family<prometheus::Histogram>,_std::default_delete<prometheus::Family<prometheus::Histogram>_>_>_*,_std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,_std::default_delete<prometheus::Family<prometheus::Histogram>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,_std::default_delete<prometheus::Family<prometheus::Histogram>_>_>_>_>_>
  local_40;
  __normal_iterator<const_std::unique_ptr<prometheus::Family<prometheus::Histogram>,_std::default_delete<prometheus::Family<prometheus::Histogram>_>_>_*,_std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,_std::default_delete<prometheus::Family<prometheus::Histogram>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,_std::default_delete<prometheus::Family<prometheus::Histogram>_>_>_>_>_>
  local_38;
  undefined1 local_29;
  anon_class_8_1_898f2789_for__M_pred aStack_28;
  bool exists;
  anon_class_8_1_898f2789_for__M_pred sameName;
  vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,_std::default_delete<prometheus::Family<prometheus::Summary>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,_std::default_delete<prometheus::Family<prometheus::Summary>_>_>_>_>
  *args_local;
  vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,_std::default_delete<prometheus::Family<prometheus::Histogram>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,_std::default_delete<prometheus::Family<prometheus::Histogram>_>_>_>_>
  *families_local;
  string *name_local;
  
  aStack_28.name = name;
  sameName.name = (string *)args;
  local_40._M_current =
       (unique_ptr<prometheus::Family<prometheus::Histogram>,_std::default_delete<prometheus::Family<prometheus::Histogram>_>_>
        *)std::
          begin<std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>>
                    (families);
  local_48 = (unique_ptr<prometheus::Family<prometheus::Histogram>,_std::default_delete<prometheus::Family<prometheus::Histogram>_>_>
              *)std::
                end<std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>>
                          (families);
  local_50 = aStack_28.name;
  local_38 = std::
             find_if<__gnu_cxx::__normal_iterator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>const*,std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>>,prometheus::(anonymous_namespace)::FamilyNameExists<std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>const&>(std::__cxx11::string_const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>const&)::_lambda(std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>const&)_1_>
                       (local_40,(__normal_iterator<const_std::unique_ptr<prometheus::Family<prometheus::Histogram>,_std::default_delete<prometheus::Family<prometheus::Histogram>_>_>_*,_std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,_std::default_delete<prometheus::Family<prometheus::Histogram>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,_std::default_delete<prometheus::Family<prometheus::Histogram>_>_>_>_>_>
                                  )local_48,aStack_28);
  local_58._M_current =
       (unique_ptr<prometheus::Family<prometheus::Histogram>,_std::default_delete<prometheus::Family<prometheus::Histogram>_>_>
        *)std::
          end<std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>>
                    (families);
  local_29 = __gnu_cxx::operator!=(&local_38,&local_58);
  local_59 = true;
  if (!(bool)local_29) {
    local_59 = FamilyNameExists<std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>>
                         (name,(vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,_std::default_delete<prometheus::Family<prometheus::Summary>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,_std::default_delete<prometheus::Family<prometheus::Summary>_>_>_>_>
                                *)sameName.name);
  }
  return local_59;
}

Assistant:

bool FamilyNameExists(const std::string& name, const T& families,
                      Args&&... args) {
  auto sameName = [&name](const typename T::value_type& entry) {
    return name == entry->GetName();
  };
  auto exists = std::find_if(std::begin(families), std::end(families),
                             sameName) != std::end(families);
  return exists || FamilyNameExists(name, args...);
}